

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  SPxOut *pSVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rhs;
  long lVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  uint *puVar7;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *x;
  byte bVar8;
  SPxId enterId;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  DataKey local_2b0;
  cpp_dec_float<200U,_int,_void> local_2a8;
  cpp_dec_float<200U,_int,_void> local_228;
  cpp_dec_float<200U,_int,_void> local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  uint local_a8 [28];
  int local_38;
  undefined1 local_34;
  undefined8 local_30;
  
  bVar8 = 0;
  local_2b0.info = 0;
  local_2b0.idx = -1;
  pnVar5 = &(this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance;
  pnVar4 = pnVar5;
  puVar7 = local_a8;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar7 = (pnVar4->m_backend).data._M_elems[0];
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar4->m_backend).data._M_elems + 1);
    puVar7 = puVar7 + 1;
  }
  local_38 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.exp;
  local_34 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.neg;
  local_30._0_4_ =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  local_30._4_4_ =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  local_2b0 = (DataKey)selectEnterX(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)local_a8);
  if ((local_2b0.info == 0) && (this->refined == false)) {
    this->refined = true;
    pSVar1 = ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
      local_2a8.data._M_elems[0] = pSVar1->m_verbosity;
      local_228.data._M_elems[0] = 5;
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = ((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],"WSTEEP05 trying refinement step..\n",0x22);
      pSVar1 = ((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->spxout;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_2a8);
    }
    local_1a8.fpclass = cpp_dec_float_finite;
    local_1a8.prec_elem = 0x1c;
    local_1a8.data._M_elems[0] = 0;
    local_1a8.data._M_elems[1] = 0;
    local_1a8.data._M_elems[2] = 0;
    local_1a8.data._M_elems[3] = 0;
    local_1a8.data._M_elems[4] = 0;
    local_1a8.data._M_elems[5] = 0;
    local_1a8.data._M_elems[6] = 0;
    local_1a8.data._M_elems[7] = 0;
    local_1a8.data._M_elems[8] = 0;
    local_1a8.data._M_elems[9] = 0;
    local_1a8.data._M_elems[10] = 0;
    local_1a8.data._M_elems[0xb] = 0;
    local_1a8.data._M_elems[0xc] = 0;
    local_1a8.data._M_elems[0xd] = 0;
    local_1a8.data._M_elems[0xe] = 0;
    local_1a8.data._M_elems[0xf] = 0;
    local_1a8.data._M_elems[0x10] = 0;
    local_1a8.data._M_elems[0x11] = 0;
    local_1a8.data._M_elems[0x12] = 0;
    local_1a8.data._M_elems[0x13] = 0;
    local_1a8.data._M_elems[0x14] = 0;
    local_1a8.data._M_elems[0x15] = 0;
    local_1a8.data._M_elems[0x16] = 0;
    local_1a8.data._M_elems[0x17] = 0;
    local_1a8.data._M_elems[0x18] = 0;
    local_1a8.data._M_elems[0x19] = 0;
    local_1a8.data._M_elems._104_5_ = 0;
    local_1a8.data._M_elems[0x1b]._1_3_ = 0;
    local_1a8.exp = 0;
    local_1a8.neg = false;
    local_2a8.fpclass = cpp_dec_float_finite;
    local_2a8.prec_elem = 0x1c;
    local_2a8.data._M_elems[0] = 0;
    local_2a8.data._M_elems[1] = 0;
    local_2a8.data._M_elems[2] = 0;
    local_2a8.data._M_elems[3] = 0;
    local_2a8.data._M_elems[4] = 0;
    local_2a8.data._M_elems[5] = 0;
    local_2a8.data._M_elems[6] = 0;
    local_2a8.data._M_elems[7] = 0;
    local_2a8.data._M_elems[8] = 0;
    local_2a8.data._M_elems[9] = 0;
    local_2a8.data._M_elems[10] = 0;
    local_2a8.data._M_elems[0xb] = 0;
    local_2a8.data._M_elems[0xc] = 0;
    local_2a8.data._M_elems[0xd] = 0;
    local_2a8.data._M_elems[0xe] = 0;
    local_2a8.data._M_elems[0xf] = 0;
    local_2a8.data._M_elems[0x10] = 0;
    local_2a8.data._M_elems[0x11] = 0;
    local_2a8.data._M_elems[0x12] = 0;
    local_2a8.data._M_elems[0x13] = 0;
    local_2a8.data._M_elems[0x14] = 0;
    local_2a8.data._M_elems[0x15] = 0;
    local_2a8.data._M_elems[0x16] = 0;
    local_2a8.data._M_elems[0x17] = 0;
    local_2a8.data._M_elems[0x18] = 0;
    local_2a8.data._M_elems[0x19] = 0;
    local_2a8.data._M_elems._104_5_ = 0;
    local_2a8.data._M_elems[0x1b]._1_3_ = 0;
    local_2a8.exp = 0;
    local_2a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_2a8,2.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_1a8,&pnVar5->m_backend,&local_2a8);
    local_2b0 = (DataKey)selectEnterX(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_1a8);
  }
  if (local_2b0.info != 0) {
    pSVar2 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    x = &pSVar2->theFvec->thedelta;
    rhs = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::vector(pSVar2,(SPxId *)&local_2b0);
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::solve4update(&pSVar2->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,x,rhs);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&this->workRhs,x);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::length2(&local_128,x);
    local_228.fpclass = cpp_dec_float_finite;
    local_228.prec_elem = 0x1c;
    local_228.data._M_elems[0] = 0;
    local_228.data._M_elems[1] = 0;
    local_228.data._M_elems[2] = 0;
    local_228.data._M_elems[3] = 0;
    local_228.data._M_elems[4] = 0;
    local_228.data._M_elems[5] = 0;
    local_228.data._M_elems[6] = 0;
    local_228.data._M_elems[7] = 0;
    local_228.data._M_elems[8] = 0;
    local_228.data._M_elems[9] = 0;
    local_228.data._M_elems[10] = 0;
    local_228.data._M_elems[0xb] = 0;
    local_228.data._M_elems[0xc] = 0;
    local_228.data._M_elems[0xd] = 0;
    local_228.data._M_elems[0xe] = 0;
    local_228.data._M_elems[0xf] = 0;
    local_228.data._M_elems[0x10] = 0;
    local_228.data._M_elems[0x11] = 0;
    local_228.data._M_elems[0x12] = 0;
    local_228.data._M_elems[0x13] = 0;
    local_228.data._M_elems[0x14] = 0;
    local_228.data._M_elems[0x15] = 0;
    local_228.data._M_elems[0x16] = 0;
    local_228.data._M_elems[0x17] = 0;
    local_228.data._M_elems[0x18] = 0;
    local_228.data._M_elems[0x19] = 0;
    local_228.data._M_elems._104_5_ = 0;
    local_228.data._M_elems[0x1b]._1_3_ = 0;
    local_228.exp = 0;
    local_228.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&local_2a8,1,(type *)0x0);
    pnVar5 = &local_128;
    pcVar6 = &local_228;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pcVar6->data)._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
      pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar5 + ((ulong)bVar8 * -2 + 1) * 4);
      pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + (ulong)bVar8 * -8 + 4);
    }
    local_228.exp = local_128.m_backend.exp;
    local_228.neg = local_128.m_backend.neg;
    local_228.fpclass = local_128.m_backend.fpclass;
    local_228.prec_elem = local_128.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              (&local_228,&local_2a8);
    pcVar6 = &local_228;
    pnVar5 = &this->pi_p;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar5->m_backend).data._M_elems[0] = (pcVar6->data)._M_elems[0];
      pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + (ulong)bVar8 * -8 + 4);
      pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar5 + (ulong)bVar8 * -8 + 4);
    }
    (this->pi_p).m_backend.exp = local_228.exp;
    (this->pi_p).m_backend.neg = local_228.neg;
    (this->pi_p).m_backend.fpclass = local_228.fpclass;
    (this->pi_p).m_backend.prec_elem = local_228.prec_elem;
    pSVar2 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pSVar2->coSolveVector2 = &this->workVec;
    pSVar2->coSolveVector2rhs = &this->workRhs;
  }
  return (SPxId)local_2b0;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);
   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WSTEEP05 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_STEEP_REFINETOL);
   }

   assert(isConsistent());

   if(enterId.isValid())
   {
      SSVectorBase<R>& delta = this->thesolver->fVec().delta();

      this->thesolver->basis().solve4update(delta, this->thesolver->vector(enterId));

      workRhs.setup_and_assign(delta);
      pi_p = 1 + delta.length2();

      this->thesolver->setup4coSolve(&workVec, &workRhs);
   }

   return enterId;
}